

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgrenderstate.cpp
# Opt level: O0

void __thiscall lunasvg::SVGRenderState::beginGroup(SVGRenderState *this,SVGBlendInfo *blendInfo)

{
  element_type *peVar1;
  SVGClipPathElement *pSVar2;
  undefined1 local_60 [20];
  Rect local_4c;
  Rect local_3c;
  undefined1 local_2c [8];
  Rect boundingBox;
  bool requiresCompositing;
  SVGBlendInfo *blendInfo_local;
  SVGRenderState *this_local;
  
  unique0x10000188 = blendInfo;
  boundingBox.w._3_1_ = SVGBlendInfo::requiresCompositing(blendInfo,this->m_mode);
  if ((bool)boundingBox.w._3_1_) {
    (*(this->m_element->super_SVGNode)._vptr_SVGNode[0xd])();
    _local_2c = Transform::mapRect(&this->m_currentTransform,&local_3c);
    peVar1 = std::__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_canvas);
    local_4c = Canvas::extents(peVar1);
    Rect::intersect((Rect *)local_2c,&local_4c);
    Canvas::create((Canvas *)local_60,(Rect *)local_2c);
    std::shared_ptr<lunasvg::Canvas>::operator=
              (&this->m_canvas,(shared_ptr<lunasvg::Canvas> *)local_60);
    std::shared_ptr<lunasvg::Canvas>::~shared_ptr((shared_ptr<lunasvg::Canvas> *)local_60);
  }
  else {
    peVar1 = std::__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_canvas);
    Canvas::save(peVar1);
  }
  if ((boundingBox.w._3_1_ & 1) == 0) {
    pSVar2 = SVGBlendInfo::clipper(stack0xffffffffffffffe8);
    if (pSVar2 != (SVGClipPathElement *)0x0) {
      pSVar2 = SVGBlendInfo::clipper(stack0xffffffffffffffe8);
      SVGClipPathElement::applyClipPath(pSVar2,this);
    }
  }
  return;
}

Assistant:

void SVGRenderState::beginGroup(const SVGBlendInfo& blendInfo)
{
    auto requiresCompositing = blendInfo.requiresCompositing(m_mode);
    if(requiresCompositing) {
        auto boundingBox = m_currentTransform.mapRect(m_element->paintBoundingBox());
        boundingBox.intersect(m_canvas->extents());
        m_canvas = Canvas::create(boundingBox);
    } else {
        m_canvas->save();
    }

    if(!requiresCompositing && blendInfo.clipper()) {
        blendInfo.clipper()->applyClipPath(*this);
    }
}